

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSurfaceTests.cpp
# Opt level: O2

TestStatus *
vkt::wsi::anon_unknown_0::querySurfaceFormatsTest
          (TestStatus *__return_storage_ptr__,Context *context,Type wsiType)

{
  pointer log;
  VkPhysicalDevice_s *pVVar1;
  undefined1 auVar2 [16];
  Handle<(vk::HandleType)25> HVar3;
  bool bVar4;
  qpTestResult qVar5;
  pointer pVVar6;
  undefined1 *puVar7;
  undefined1 *puVar8;
  uint uVar9;
  long lVar10;
  ulong __n;
  allocator<char> local_481;
  undefined **local_480;
  undefined8 local_478;
  Type local_46c;
  vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_> formats;
  vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_> outputData;
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> physicalDevices;
  RefBase<vk::Handle<(vk::HandleType)25>_> local_3f8;
  NativeObjects native;
  ResultCollector results;
  undefined1 local_368 [8];
  anon_union_8_2_d0736028_for_Maybe<tcu::Vector<unsigned_int,_2>_>_2 aStack_360;
  VkInstance local_358;
  VkAllocationCallbacks *pVStack_350;
  InstanceHelper instHelper;
  
  log = (pointer)context->m_testCtx->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&instHelper,"",(allocator<char> *)local_368);
  tcu::ResultCollector::ResultCollector(&results,(TestLog *)log,(string *)&instHelper);
  std::__cxx11::string::~string((string *)&instHelper);
  InstanceHelper::InstanceHelper(&instHelper,context,wsiType,(VkAllocationCallbacks *)0x0);
  local_368 = (undefined1  [8])0x0;
  NativeObjects::NativeObjects
            (&native,context,&instHelper.supportedExtensions,wsiType,
             (Maybe<tcu::Vector<unsigned_int,_2>_> *)local_368);
  ::vk::wsi::createSurface
            ((Move<vk::Handle<(vk::HandleType)25>_> *)local_368,
             &instHelper.vki.super_InstanceInterface,
             instHelper.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object,wsiType,
             native.display.
             super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.m_data.ptr,
             native.window.super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.
             m_data.ptr,(VkAllocationCallbacks *)0x0);
  local_3f8.m_data.deleter.m_instance = local_358;
  local_3f8.m_data.deleter.m_allocator = pVStack_350;
  local_3f8.m_data.object.m_internal = (deUint64)local_368;
  local_3f8.m_data.deleter.m_instanceIface = (InstanceInterface *)aStack_360;
  local_368 = (undefined1  [8])0x0;
  aStack_360.m_align = 0;
  local_358 = (VkInstance)0x0;
  pVStack_350 = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)25>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)25>_> *)local_368);
  ::vk::enumeratePhysicalDevices
            (&physicalDevices,&instHelper.vki.super_InstanceInterface,
             instHelper.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object);
  puVar7 = (undefined1 *)0x0;
  puVar8 = wsi::(anonymous_namespace)::
           validateSurfaceFormats(tcu::ResultCollector&,vk::wsi::Type,std::vector<vk::VkSurfaceFormatKHR,std::allocator<vk::VkSurfaceFormatKHR>>const&)
           ::s_androidFormats;
  if (wsiType != TYPE_ANDROID) {
    puVar8 = puVar7;
  }
  local_46c = wsiType;
  do {
    if ((undefined1 *)
        ((long)physicalDevices.
               super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)physicalDevices.
               super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3) <= puVar7) {
      qVar5 = tcu::ResultCollector::getResult(&results);
      std::__cxx11::string::string((string *)local_368,(string *)&results.m_message);
      __return_storage_ptr__->m_code = qVar5;
      std::__cxx11::string::string
                ((string *)&__return_storage_ptr__->m_description,(string *)local_368);
      std::__cxx11::string::~string((string *)local_368);
      std::_Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::
      ~_Vector_base(&physicalDevices.
                     super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                   );
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)25>_>::~RefBase(&local_3f8);
      NativeObjects::~NativeObjects(&native);
      InstanceHelper::~InstanceHelper(&instHelper);
      tcu::ResultCollector::~ResultCollector(&results);
      return __return_storage_ptr__;
    }
    bVar4 = isSupportedByAnyQueue
                      (&instHelper.vki.super_InstanceInterface,
                       physicalDevices.
                       super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)puVar7],
                       (VkSurfaceKHR)local_3f8.m_data.object.m_internal);
    if (bVar4) {
      ::vk::wsi::getPhysicalDeviceSurfaceFormats
                (&formats,&instHelper.vki.super_InstanceInterface,
                 physicalDevices.
                 super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[(long)puVar7],
                 (VkSurfaceKHR)local_3f8.m_data.object.m_internal);
      local_368 = (undefined1  [8])log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)aStack_360.m_data);
      std::operator<<((ostream *)aStack_360.m_data,"Device ");
      std::ostream::_M_insert<unsigned_long>((ulong)&aStack_360);
      std::operator<<((ostream *)aStack_360.m_data,": ");
      outputData.super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
      ._M_impl.super__Vector_impl_data._M_start =
           formats.
           super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>.
           _M_impl.super__Vector_impl_data._M_start;
      outputData.super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           formats.
           super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      tcu::Format::operator<<
                ((ostream *)aStack_360.m_data,
                 (Array<__gnu_cxx::__normal_iterator<const_vk::VkSurfaceFormatKHR_*,_std::vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>_>_>
                  *)&outputData);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_368,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)aStack_360.m_data);
      if (wsiType == TYPE_ANDROID) {
        for (lVar10 = 0; lVar10 != 0x18; lVar10 = lVar10 + 8) {
          local_368 = (undefined1  [8])
                      formats.
                      super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          outputData.
          super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>.
          _M_impl.super__Vector_impl_data._M_start =
               formats.
               super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          bVar4 = de::
                  contains<__gnu_cxx::__normal_iterator<vk::VkSurfaceFormatKHR_const*,std::vector<vk::VkSurfaceFormatKHR,std::allocator<vk::VkSurfaceFormatKHR>>>,vk::VkSurfaceFormatKHR>
                            ((__normal_iterator<const_vk::VkSurfaceFormatKHR_*,_std::vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>_>
                              *)local_368,
                             (__normal_iterator<const_vk::VkSurfaceFormatKHR_*,_std::vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>_>
                              *)&outputData,(VkSurfaceFormatKHR *)(puVar8 + lVar10));
          if (!bVar4) {
            de::toString<vk::VkSurfaceFormatKHR>
                      ((string *)&outputData,(VkSurfaceFormatKHR *)(puVar8 + lVar10));
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_368,(string *)&outputData," not supported");
            tcu::ResultCollector::fail(&results,(string *)local_368);
            std::__cxx11::string::~string((string *)local_368);
            std::__cxx11::string::~string((string *)&outputData);
          }
        }
      }
      HVar3.m_internal = local_3f8.m_data.object.m_internal;
      local_478 = 0;
      local_480 = &PTR__CheckIncompleteResult_00bd9988;
      if ((long)formats.
                super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)formats.
                super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>.
                _M_impl.super__Vector_impl_data._M_start != 0) {
        __n = (long)formats.
                    super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)formats.
                    super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3;
        pVVar1 = physicalDevices.
                 super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[(long)puVar7];
        std::vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>::vector
                  (&outputData,__n,(allocator_type *)local_368);
        for (pVVar6 = outputData.
                      super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pVVar6 < outputData.
                     super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
                     ._M_impl.super__Vector_impl_data._M_finish; pVVar6 = pVVar6 + 1) {
          pVVar6->format = 0xdededede;
          pVVar6->colorSpace = 0xdededede;
        }
        auVar2._8_8_ = 0;
        auVar2._0_8_ = __n;
        uVar9 = SUB164(auVar2 / ZEXT816(3),0);
        local_478 = (ulong)uVar9;
        (*(code *)local_480[2])
                  (&local_480,&instHelper.vki,pVVar1,HVar3.m_internal,
                   outputData.
                   super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        if (((uint)local_478 == uVar9) && (local_478._4_4_ == 5)) {
          bVar4 = ::vk::ValidateQueryBits::
                  checkBits<__gnu_cxx::__normal_iterator<vk::VkSurfaceFormatKHR*,std::vector<vk::VkSurfaceFormatKHR,std::allocator<vk::VkSurfaceFormatKHR>>>>
                            (outputData.
                             super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
                             ._M_impl.super__Vector_impl_data._M_start +
                             (SUB168(auVar2 / ZEXT816(3),0) & 0xffffffff),
                             (__normal_iterator<vk::VkSurfaceFormatKHR_*,_std::vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>_>
                              )outputData.
                               super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
                               ._M_impl.super__Vector_impl_data._M_finish,0xde);
          if (!bVar4) goto LAB_006c4b17;
        }
        else {
LAB_006c4b17:
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_368,"Query didn\'t return VK_INCOMPLETE",&local_481);
          tcu::ResultCollector::fail(&results,(string *)local_368);
          std::__cxx11::string::~string((string *)local_368);
        }
        std::_Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>::
        ~_Vector_base((_Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
                       *)&outputData);
      }
      std::_Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>::
      ~_Vector_base(&formats.
                     super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
                   );
      wsiType = local_46c;
    }
    puVar7 = puVar7 + 1;
  } while( true );
}

Assistant:

tcu::TestStatus querySurfaceFormatsTest (Context& context, Type wsiType)
{
	tcu::TestLog&					log				= context.getTestContext().getLog();
	tcu::ResultCollector			results			(log);

	const InstanceHelper			instHelper		(context, wsiType);
	const NativeObjects				native			(context, instHelper.supportedExtensions, wsiType);
	const Unique<VkSurfaceKHR>		surface			(createSurface(instHelper.vki, *instHelper.instance, wsiType, *native.display, *native.window));
	const vector<VkPhysicalDevice>	physicalDevices	= enumeratePhysicalDevices(instHelper.vki, *instHelper.instance);

	for (size_t deviceNdx = 0; deviceNdx < physicalDevices.size(); ++deviceNdx)
	{
		if (isSupportedByAnyQueue(instHelper.vki, physicalDevices[deviceNdx], *surface))
		{
			const vector<VkSurfaceFormatKHR>	formats	= getPhysicalDeviceSurfaceFormats(instHelper.vki,
																						  physicalDevices[deviceNdx],
																						  *surface);

			log << TestLog::Message << "Device " << deviceNdx << ": " << tcu::formatArray(formats.begin(), formats.end()) << TestLog::EndMessage;

			validateSurfaceFormats(results, wsiType, formats);
			CheckPhysicalDeviceSurfaceFormatsIncompleteResult()(results, instHelper.vki, physicalDevices[deviceNdx], *surface, formats.size());
		}
		// else skip query as surface is not supported by the device
	}

	return tcu::TestStatus(results.getResult(), results.getMessage());
}